

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

HighsTripletListSlice * __thiscall
presolve::HPresolve::getColumnVector(HPresolve *this,HighsInt col)

{
  HighsTripletListSlice *this_00;
  int in_EDX;
  double *in_RSI;
  HighsTripletListSlice *in_RDI;
  HighsInt *in_stack_ffffffffffffffb8;
  HighsTripletListSlice *pHVar1;
  
  pHVar1 = in_RDI;
  this_00 = (HighsTripletListSlice *)
            std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x6ed19a);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x6ed1ad);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x6ed1c3);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RSI + 0xe),(long)in_EDX);
  HighsTripletListSlice::HighsMatrixSlice
            (this_00,(HighsInt *)pHVar1,in_RSI,in_stack_ffffffffffffffb8,0);
  return in_RDI;
}

Assistant:

HighsTripletListSlice HPresolve::getColumnVector(HighsInt col) const {
  return HighsTripletListSlice(Arow.data(), Avalue.data(), Anext.data(),
                               colhead[col]);
}